

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

int32_t ecs_get_child_count(ecs_world_t *world,ecs_entity_t entity)

{
  int32_t iVar1;
  int32_t iVar2;
  ecs_vector_t *vector;
  void *pvVar3;
  ecs_table_t *table;
  ecs_table_t **table_ptr;
  ecs_table_t **table_ptr_array;
  int local_30;
  int table_ptr_count;
  int table_ptr_i;
  int32_t count;
  ecs_vector_t *tables;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  vector = (ecs_vector_t *)_ecs_map_get_ptr(world->child_tables,entity);
  if (vector == (ecs_vector_t *)0x0) {
    world_local._4_4_ = 0;
  }
  else {
    table_ptr_count = 0;
    iVar1 = ecs_vector_count(vector);
    pvVar3 = _ecs_vector_first(vector,8,0x10);
    for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
      iVar2 = ecs_table_count(*(ecs_table_t **)((long)pvVar3 + (long)local_30 * 8));
      table_ptr_count = iVar2 + table_ptr_count;
    }
    world_local._4_4_ = table_ptr_count;
  }
  return world_local._4_4_;
}

Assistant:

int32_t ecs_get_child_count(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_vector_t *tables = ecs_map_get_ptr(world->child_tables, ecs_vector_t*, entity);
    if (!tables) {
        return 0;
    } else {
        int32_t count = 0;

        ecs_vector_each(tables, ecs_table_t*, table_ptr, {
            ecs_table_t *table = *table_ptr;
            count += ecs_table_count(table);
        });

        return count;
    }
}